

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool ON::IsDirectory(wchar_t *pathname)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  bool bVar4;
  int iVar5;
  wchar_t *pwVar6;
  char *utf8pathname;
  ON_String s;
  ON_wString buffer;
  ON_String local_18;
  ON_wString local_10;
  
  if ((pathname == (wchar_t *)0x0) || (*pathname == L'\0')) {
    bVar4 = false;
  }
  else {
    ON_wString::ON_wString(&local_10);
    pwVar3 = pathname;
    do {
      pwVar6 = pwVar3;
      pwVar3 = pwVar6 + 1;
    } while (*pwVar6 != L'\0');
    wVar1 = pwVar6[-1];
    if ((wVar1 == L'\\') || (wVar1 == L'/')) {
      local_18.m_s._4_4_ = 0;
      local_18.m_s._0_4_ = wVar1;
      ON_wString::operator=(&local_10,pathname);
      ON_wString::TrimRight(&local_10,(wchar_t *)&local_18);
      iVar5 = ON_wString::Length(&local_10);
      if (0 < iVar5) {
        pathname = ON_wString::operator_cast_to_wchar_t_(&local_10);
      }
    }
    ON_String::ON_String(&local_18,pathname);
    pcVar2 = (char *)CONCAT44(local_18.m_s._4_4_,(wchar_t)local_18.m_s);
    utf8pathname = pcVar2;
    if (pcVar2 == &empty_astring.s) {
      utf8pathname = "";
    }
    if (pcVar2 == (char *)0x0) {
      utf8pathname = "";
    }
    bVar4 = IsDirectory(utf8pathname);
    ON_String::~ON_String(&local_18);
    ON_wString::~ON_wString(&local_10);
  }
  return bVar4;
}

Assistant:

bool ON::IsDirectory( const wchar_t* pathname )
{
  bool rc = false;

  if ( 0 != pathname && 0 != pathname[0] )
  {
    ON_wString buffer;
    const wchar_t* stail = pathname;
    while ( 0 != *stail )
      stail++;
    stail--;
    if ( '\\' == *stail || '/' == *stail ) 
    {
      const wchar_t trim[2] = {*stail,0};
      buffer = pathname;
      buffer.TrimRight(trim);
      if ( buffer.Length() > 0 )
        pathname = static_cast< const wchar_t* >(buffer);
    }
#if defined(ON_COMPILER_MSC)
    // this works on Windows
    struct _stat64 buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = _wstat64( pathname, &buf );
    if ( 0 == stat_errno && 0 != (_S_IFDIR & buf.st_mode) )
    {
      rc = true;
    }
#else
    ON_String s = pathname;
    const char* utf8pathname = s;
    rc = ON::IsDirectory(utf8pathname);
#endif
  }

  return rc;
}